

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O0

void __thiscall hta::storage::file::Metric::Metric(Metric *this,path *param_2)

{
  path local_58;
  path *local_20;
  path *path_local;
  Metric *this_local;
  
  local_20 = param_2;
  path_local = (path *)this;
  storage::Metric::Metric(&this->super_Metric);
  (this->super_Metric)._vptr_Metric = (_func_int **)&PTR_meta_00156cd8;
  this->open_mode_ = read;
  std::filesystem::__cxx11::path::path(&this->path_,local_20);
  path_raw_abi_cxx11_(&local_58,this);
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::File(&this->file_raw_,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::
  map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>_>
  ::map(&this->files_hta_);
  return;
}

Assistant:

Metric(FileOpenTag::Read file_open_tag, const std::filesystem::path& path)
    : open_mode_(file_open_tag.mode), path_(path), file_raw_(file_open_tag, path_raw())
    {
    }